

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O3

void __thiscall
MetadataTest_CopyMetadataToFrameBuffer_Test::TestBody
          (MetadataTest_CopyMetadataToFrameBuffer_Test *this)

{
  undefined8 *puVar1;
  aom_metadata_t *paVar2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  SEARCH_METHODS *pSVar4;
  aom_metadata_array_t *metadata_array_2;
  int status;
  aom_metadata_array_t *metadata_array;
  YV12_BUFFER_CONFIG yvBuf;
  AssertHelper local_110;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_108;
  internal local_100 [8];
  undefined8 *local_f8;
  AssertHelper local_f0;
  int local_e4;
  aom_metadata_array_t *local_e0;
  YV12_BUFFER_CONFIG local_d8;
  
  local_d8.metadata = (aom_metadata_array_t *)0x0;
  local_e0 = aom_img_metadata_array_alloc(1);
  local_108._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<aom_metadata_array*,decltype(nullptr)>
            (local_100,"metadata_array","nullptr",&local_e0,&local_108._M_head_impl);
  puVar1 = local_f8;
  if (local_100[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f8 == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = (SEARCH_METHODS *)*local_f8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
               ,0x1e6,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    _Var3._M_head_impl = local_108._M_head_impl;
  }
  else {
    if (local_f8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_f8 != local_f8 + 2) {
        operator_delete((undefined8 *)*local_f8);
      }
      operator_delete(puVar1);
    }
    paVar2 = aom_img_metadata_alloc
                       (4,(anonymous_namespace)::kMetadataPayloadT35,0x18,AOM_MIF_ANY_FRAME);
    *local_e0->metadata_array = paVar2;
    local_e4 = aom_copy_metadata_to_frame_buffer(&local_d8,local_e0);
    local_108._M_head_impl = local_108._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,int>(local_100,"status","0",&local_e4,(int *)&local_108);
    if (local_100[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_108);
      if (local_f8 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_f8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
                 ,0x1ee,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      if (local_108._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_108._M_head_impl + 8))();
      }
    }
    puVar1 = local_f8;
    if (local_f8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_f8 != local_f8 + 2) {
        operator_delete((undefined8 *)*local_f8);
      }
      operator_delete(puVar1);
    }
    local_e4 = aom_copy_metadata_to_frame_buffer((YV12_BUFFER_CONFIG *)0x0,local_e0);
    local_108._M_head_impl._0_4_ = 0xffffffff;
    testing::internal::CmpHelperEQ<int,int>(local_100,"status","-1",&local_e4,(int *)&local_108);
    if (local_100[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_108);
      if (local_f8 == (undefined8 *)0x0) {
        pSVar4 = "";
      }
      else {
        pSVar4 = (SEARCH_METHODS *)*local_f8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
                 ,0x1f0,(char *)pSVar4);
      testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      if (local_108._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_108._M_head_impl + 8))();
      }
    }
    puVar1 = local_f8;
    if (local_f8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_f8 != local_f8 + 2) {
        operator_delete((undefined8 *)*local_f8);
      }
      operator_delete(puVar1);
    }
    aom_img_metadata_array_free(local_e0);
    local_108._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         aom_img_metadata_array_alloc(0);
    local_110.data_ = (AssertHelperData *)0x0;
    testing::internal::CmpHelperNE<aom_metadata_array*,decltype(nullptr)>
              (local_100,"metadata_array_2","nullptr",(aom_metadata_array **)&local_108,
               &local_110.data_);
    puVar1 = local_f8;
    if (local_100[0] != (internal)0x0) {
      if (local_f8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_f8 != local_f8 + 2) {
          operator_delete((undefined8 *)*local_f8);
        }
        operator_delete(puVar1);
      }
      local_e4 = aom_copy_metadata_to_frame_buffer
                           (&local_d8,(aom_metadata_array_t *)local_108._M_head_impl);
      local_110.data_._0_4_ = 0xffffffff;
      testing::internal::CmpHelperEQ<int,int>(local_100,"status","-1",&local_e4,(int *)&local_110);
      if (local_100[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_110);
        if (local_f8 == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = (SEARCH_METHODS *)*local_f8;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
                   ,0x1f7,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_110);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        if (local_110.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_110.data_ + 8))();
        }
      }
      puVar1 = local_f8;
      if (local_f8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_f8 != local_f8 + 2) {
          operator_delete((undefined8 *)*local_f8);
        }
        operator_delete(puVar1);
      }
      aom_img_metadata_array_free((aom_metadata_array_t *)local_108._M_head_impl);
      local_e4 = aom_copy_metadata_to_frame_buffer(&local_d8,(aom_metadata_array_t *)0x0);
      local_110.data_._0_4_ = 0xffffffff;
      testing::internal::CmpHelperEQ<int,int>(local_100,"status","-1",&local_e4,(int *)&local_110);
      if (local_100[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_110);
        if (local_f8 == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = (SEARCH_METHODS *)*local_f8;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
                   ,0x1fc,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_110);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        if (local_110.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_110.data_ + 8))();
        }
      }
      if (local_f8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_f8 != local_f8 + 2) {
          operator_delete((undefined8 *)*local_f8);
        }
        operator_delete(local_f8);
      }
      aom_remove_metadata_from_frame_buffer(&local_d8);
      aom_remove_metadata_from_frame_buffer((YV12_BUFFER_CONFIG *)0x0);
      return;
    }
    testing::Message::Message((Message *)&local_110);
    if (local_f8 == (undefined8 *)0x0) {
      pSVar4 = "";
    }
    else {
      pSVar4 = (SEARCH_METHODS *)*local_f8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
               ,0x1f5,(char *)pSVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    _Var3._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110.data_;
  }
  if ((AssertHelperData *)_Var3._M_head_impl != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)_Var3._M_head_impl + 8))();
  }
  if (local_f8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_f8 != local_f8 + 2) {
      operator_delete((undefined8 *)*local_f8);
    }
    operator_delete(local_f8);
  }
  return;
}

Assistant:

TEST(MetadataTest, CopyMetadataToFrameBuffer) {
  YV12_BUFFER_CONFIG yvBuf;
  yvBuf.metadata = nullptr;

  aom_metadata_array_t *metadata_array = aom_img_metadata_array_alloc(1);
  ASSERT_NE(metadata_array, nullptr);

  metadata_array->metadata_array[0] =
      aom_img_metadata_alloc(OBU_METADATA_TYPE_ITUT_T35, kMetadataPayloadT35,
                             kMetadataPayloadSizeT35, AOM_MIF_ANY_FRAME);

  // Metadata_array
  int status = aom_copy_metadata_to_frame_buffer(&yvBuf, metadata_array);
  EXPECT_EQ(status, 0);
  status = aom_copy_metadata_to_frame_buffer(nullptr, metadata_array);
  EXPECT_EQ(status, -1);
  aom_img_metadata_array_free(metadata_array);

  // Metadata_array_2
  aom_metadata_array_t *metadata_array_2 = aom_img_metadata_array_alloc(0);
  ASSERT_NE(metadata_array_2, nullptr);
  status = aom_copy_metadata_to_frame_buffer(&yvBuf, metadata_array_2);
  EXPECT_EQ(status, -1);
  aom_img_metadata_array_free(metadata_array_2);

  // YV12_BUFFER_CONFIG
  status = aom_copy_metadata_to_frame_buffer(&yvBuf, nullptr);
  EXPECT_EQ(status, -1);
  aom_remove_metadata_from_frame_buffer(&yvBuf);
  aom_remove_metadata_from_frame_buffer(nullptr);
}